

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O3

void __thiscall duckdb::LogicalGet::ResolveTypes(LogicalGet *this)

{
  vector<duckdb::LogicalType,_true> *this_00;
  pointer pLVar1;
  pointer pLVar2;
  size_type *psVar3;
  size_type *psVar4;
  size_type __n;
  pointer pCVar5;
  reference index_00;
  LogicalType *pLVar6;
  reference this_01;
  pointer pLVar7;
  reference __x;
  InternalException *this_02;
  iterator __begin2;
  size_type *psVar8;
  size_type *psVar9;
  pointer this_03;
  ColumnIndex *index;
  pointer index_01;
  string local_50;
  
  if ((this->column_ids).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->column_ids).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50._M_dataplus._M_p = (pointer)GetAnyColumn(this);
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::
    emplace_back<unsigned_long>
              (&(this->column_ids).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,
               (unsigned_long *)&local_50);
  }
  pLVar1 = (this->super_LogicalOperator).types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->super_LogicalOperator).types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_03 = pLVar1;
  if (pLVar2 != pLVar1) {
    do {
      LogicalType::~LogicalType(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != pLVar2);
    (this->super_LogicalOperator).types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
  }
  this_00 = &(this->super_LogicalOperator).types;
  psVar8 = (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar3 = (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar8 == psVar3) {
    pCVar5 = (this->column_ids).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (index_01 = (this->column_ids).
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start; index_01 != pCVar5;
        index_01 = index_01 + 1) {
      pLVar6 = GetColumnType(this,index_01);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,pLVar6
                );
    }
  }
  else {
    do {
      index_00 = vector<duckdb::ColumnIndex,_true>::operator[](&this->column_ids,*psVar8);
      pLVar6 = GetColumnType(this,index_00);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,pLVar6
                );
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar3);
  }
  psVar9 = (this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar4 = (this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar9 != psVar4) {
    if ((long)(this->super_LogicalOperator).children.
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_LogicalOperator).children.
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "LogicalGet::project_input can only be set for table-in-out functions","");
      InternalException::InternalException(this_02,&local_50);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    do {
      __n = *psVar9;
      this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&(this->super_LogicalOperator).children,0);
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(this_01);
      __x = vector<duckdb::LogicalType,_true>::operator[](&pLVar7->types,__n);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,__x);
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar4);
  }
  return;
}

Assistant:

void LogicalGet::ResolveTypes() {
	if (column_ids.empty()) {
		// no projection - we need to push a column
		column_ids.emplace_back(GetAnyColumn());
	}
	types.clear();
	if (projection_ids.empty()) {
		for (auto &index : column_ids) {
			types.push_back(GetColumnType(index));
		}
	} else {
		for (auto &proj_index : projection_ids) {
			auto &index = column_ids[proj_index];
			types.push_back(GetColumnType(index));
		}
	}
	if (!projected_input.empty()) {
		if (children.size() != 1) {
			throw InternalException("LogicalGet::project_input can only be set for table-in-out functions");
		}
		for (auto entry : projected_input) {
			D_ASSERT(entry < children[0]->types.size());
			types.push_back(children[0]->types[entry]);
		}
	}
}